

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

uchar * __thiscall
QResourceFileEnginePrivate::map
          (QResourceFileEnginePrivate *this,qint64 offset,qint64 size,MemoryMapFlags flags)

{
  QResource *this_00;
  QAbstractFileEngine *this_01;
  bool bVar1;
  qint64 qVar2;
  char *pcVar3;
  uchar *puVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  this_00 = &this->resource;
  qVar2 = QResource::uncompressedSize(this_00);
  if ((((size < 1 || offset < 0) || (bVar1 = QResource::isValid(this_00), !bVar1)) ||
      (SCARRY8(size,offset))) || (qVar2 < size + offset)) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    QAbstractFileEngine::setError(this_01,UnspecifiedError,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    puVar4 = (uchar *)0x0;
  }
  else {
    pcVar3 = (this->uncompressed).d.ptr;
    bVar1 = QByteArray::isNull(&this->uncompressed);
    if ((bVar1) &&
       (pcVar3 = (char *)QResource::data(this_00),
       ((uint)flags.super_QFlagsStorageHelper<QFileDevice::MemoryMapFlag,_4>.
              super_QFlagsStorage<QFileDevice::MemoryMapFlag>.i & 1) != 0)) {
      mapUncompressed(this);
      pcVar3 = (this->uncompressed).d.ptr;
      if ((uchar *)pcVar3 == (uchar *)0x0) {
        pcVar3 = &QByteArray::_empty;
      }
    }
    puVar4 = (uchar *)pcVar3 + offset;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return puVar4;
}

Assistant:

uchar *QResourceFileEnginePrivate::map(qint64 offset, qint64 size, QFile::MemoryMapFlags flags)
{
    Q_Q(QResourceFileEngine);
    Q_ASSERT_X(resource.compressionAlgorithm() == QResource::NoCompression
               || !uncompressed.isNull(), "QFile::map()",
               "open() should have uncompressed compressed resources");

    qint64 max = resource.uncompressedSize();
    qint64 end;
    if (offset < 0 || size <= 0 || !resource.isValid() ||
            qAddOverflow(offset, size, &end) || end > max) {
        q->setError(QFile::UnspecifiedError, QString());
        return nullptr;
    }

    const uchar *address = reinterpret_cast<const uchar *>(uncompressed.constBegin());
    if (!uncompressed.isNull())
        return const_cast<uchar *>(address) + offset;

    // resource was not compressed
    address = resource.data();
    if (flags & QFile::MapPrivateOption) {
        // We need to provide read-write memory
        mapUncompressed();
        address = reinterpret_cast<const uchar *>(uncompressed.constData());
    }

    return const_cast<uchar *>(address) + offset;
}